

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::get_pred_per_update<true,false,true,0ul,1ul,2ul,true>(gd *g,example *ec)

{
  float *in_RSI;
  double *in_RDI;
  float fVar1;
  float tw;
  float nsnx;
  norm_data nd;
  float grad_squared;
  vw *all;
  label_data *ld;
  example *all_00;
  undefined1 local_38 [12];
  float local_2c;
  uchar *local_28;
  float *local_20;
  float *local_18;
  double *local_10;
  
  local_20 = in_RSI + 0x1a0a;
  local_28 = (uchar *)in_RDI[0xc];
  local_2c = in_RSI[0x1a1c];
  all_00 = (example *)local_38;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    *(undefined4 *)&(all_00->super_example_predict).indices._begin = 0;
    all_00 = (example *)((long)&(all_00->super_example_predict).indices._begin + 4);
  } while (all_00 != (example *)&stack0xffffffffffffffd4);
  foreach_feature<GD::norm_data,_&GD::pred_per_update_feature>
            ((vw *)all_00,(example *)&stack0xffffffffffffffd4,(norm_data *)0x1f17a0);
  fVar1 = average_update<true,0ul,1ul>
                    ((float)*local_10 + local_18[0x1a1c],
                     local_18[0x1a1c] * 0.0 + (float)*(double *)((long)local_10[0xc] + 0xd0),
                     *(float *)((long)local_10 + 0x1c));
  *(float *)(local_10 + 5) = fVar1;
  return *(float *)(local_10 + 5) * 0.0;
}

Assistant:

float get_pred_per_update(gd& g, example& ec)
{
  // We must traverse the features in _precisely_ the same order as during training.
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float grad_squared = ec.weight;
  if (!adax)
    grad_squared *= all.loss->getSquareGrad(ec.pred.scalar, ld.label);

  if (grad_squared == 0 && !stateless)
    return 1.;

  norm_data nd = {grad_squared, 0., 0., {g.neg_power_t, g.neg_norm_power}, {0}};
  foreach_feature<norm_data,
      pred_per_update_feature<sqrt_rate, feature_mask_off, adaptive, normalized, spare, stateless> >(all, ec, nd);
  if (normalized)
  {
    if (!stateless)
    {
      g.all->normalized_sum_norm_x += ((double)ec.weight) * nd.norm_x;
      g.total_weight += ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(
          (float)g.total_weight, (float)g.all->normalized_sum_norm_x, g.neg_norm_power);
    }
    else
    {
      float nsnx = ((float)g.all->normalized_sum_norm_x) + ec.weight * nd.norm_x;
      float tw = (float)g.total_weight + ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(tw, nsnx, g.neg_norm_power);
    }
    nd.pred_per_update *= g.update_multiplier;
  }
  return nd.pred_per_update;
}